

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_url_decode(char *src,int src_len,char *dst,int dst_len,int is_form_url_encoded)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ushort *puVar6;
  bool bVar7;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  int iVar10;
  ulong uVar11;
  
  bVar7 = 0 < src_len;
  uVar11 = 0;
  if (1 < dst_len && 0 < src_len) {
    uVar11 = 0;
    iVar10 = 0;
    do {
      cVar1 = src[iVar10];
      if (iVar10 < src_len + -2 && cVar1 == '%') {
        ppuVar8 = __ctype_b_loc();
        puVar6 = *ppuVar8;
        bVar2 = src[(long)iVar10 + 1];
        if (((*(byte *)((long)puVar6 + (ulong)bVar2 * 2 + 1) & 0x10) == 0) ||
           (bVar3 = src[(long)iVar10 + 2],
           (*(byte *)((long)puVar6 + (ulong)bVar3 * 2 + 1) & 0x10) == 0)) {
LAB_00106079:
          dst[uVar11] = cVar1;
        }
        else {
          pp_Var9 = __ctype_tolower_loc();
          iVar4 = (*pp_Var9)[bVar2];
          iVar5 = (*pp_Var9)[bVar3];
          cVar1 = (char)iVar5;
          bVar2 = cVar1 + 0xa9;
          if ((puVar6[iVar5] >> 0xb & 1) != 0) {
            bVar2 = cVar1 - 0x30;
          }
          dst[uVar11] = bVar2 | (((puVar6[iVar4] >> 0xb & 1) == 0) * '\t' + (char)iVar4) * '\x10';
          iVar10 = iVar10 + 2;
        }
      }
      else {
        if ((is_form_url_encoded == 0) || (cVar1 != '+')) goto LAB_00106079;
        dst[uVar11] = ' ';
      }
      iVar10 = iVar10 + 1;
      uVar11 = uVar11 + 1;
      bVar7 = iVar10 < src_len;
    } while ((iVar10 < src_len) && (uVar11 < dst_len - 1));
  }
  dst[uVar11 & 0xffffffff] = '\0';
  iVar10 = -1;
  if (!bVar7) {
    iVar10 = (int)uVar11;
  }
  return iVar10;
}

Assistant:

int mg_url_decode(const char *src, int src_len, char *dst,
                  int dst_len, int is_form_url_encoded) {
  int i, j, a, b;
#define HEXTOI(x) (isdigit(x) ? x - '0' : x - 'W')

  for (i = j = 0; i < src_len && j < dst_len - 1; i++, j++) {
    if (src[i] == '%' && i < src_len - 2 &&
        isxdigit(* (const unsigned char *) (src + i + 1)) &&
        isxdigit(* (const unsigned char *) (src + i + 2))) {
      a = tolower(* (const unsigned char *) (src + i + 1));
      b = tolower(* (const unsigned char *) (src + i + 2));
      dst[j] = (char) ((HEXTOI(a) << 4) | HEXTOI(b));
      i += 2;
    } else if (is_form_url_encoded && src[i] == '+') {
      dst[j] = ' ';
    } else {
      dst[j] = src[i];
    }
  }

  dst[j] = '\0'; // Null-terminate the destination

  return i >= src_len ? j : -1;
}